

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_signal.hpp
# Opt level: O2

int __thiscall
Signal<std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
::ConnectMember<SpeciesTracker>
          (Signal<std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
           *this,SpeciesTracker *inst,offset_in_SpeciesTracker_to_subr func)

{
  int iVar1;
  function<void_(std::shared_ptr<PolymerWrapper>,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  fStack_48;
  anon_class_24_2_3f47e9d7 local_28;
  
  local_28.inst = inst;
  local_28.func = func;
  std::
  function<void(std::shared_ptr<PolymerWrapper>,std::__cxx11::string_const&,std::__cxx11::string_const&)>
  ::
  function<Signal<std::shared_ptr<PolymerWrapper>,std::__cxx11::string_const&,std::__cxx11::string_const&>::ConnectMember<SpeciesTracker>(SpeciesTracker*,void(SpeciesTracker::*)(std::shared_ptr<PolymerWrapper>,std::__cxx11::string_const&,std::__cxx11::string_const&))::_lambda(std::shared_ptr<PolymerWrapper>,std::__cxx11::string_const&,std::__cxx11::string_const&)_1_,void>
            ((function<void(std::shared_ptr<PolymerWrapper>,std::__cxx11::string_const&,std::__cxx11::string_const&)>
              *)&fStack_48,&local_28);
  iVar1 = Connect(this,&fStack_48);
  std::_Function_base::~_Function_base(&fStack_48.super__Function_base);
  return iVar1;
}

Assistant:

int ConnectMember(T *inst, void (T::*func)(Args...)) {
    return Connect([=](Args... args) { (inst->*func)(args...); });
  }